

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

void __thiscall
cppcms::anon_unknown_0::base_handler<std::function<void_()>_>::~base_handler
          (base_handler<std::function<void_()>_> *this)

{
  _Manager_type p_Var1;
  
  (this->super_option)._vptr_option = (_func_int **)&PTR__base_handler_00288da8;
  p_Var1 = (this->handle_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->handle_,(_Any_data *)&this->handle_,__destroy_functor);
  }
  option::~option(&this->super_option);
  operator_delete(this);
  return;
}

Assistant:

base_handler(std::string expr,H handle,int a=0,int b=0,int c=0,int d=0,int e=0,int f=0)
				: option(expr),handle_(handle)
			{
				select_[0]=a;
				select_[1]=b;
				select_[2]=c;
				select_[3]=d;
				select_[4]=e;
				select_[5]=f;
			}